

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.h
# Opt level: O2

void __thiscall
soplex::SPxParMultPR<double>::SPxParMultPR(SPxParMultPR<double> *this,SPxParMultPR<double> *old)

{
  SPxSolverBase<double> *pSVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  pSVar1 = (old->super_SPxPricer<double>).thesolver;
  (this->super_SPxPricer<double>).m_name = (old->super_SPxPricer<double>).m_name;
  (this->super_SPxPricer<double>).thesolver = pSVar1;
  (this->super_SPxPricer<double>).thetolerance = (old->super_SPxPricer<double>).thetolerance;
  (this->super_SPxPricer<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_SPxPricer<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_SPxPricer<double>).compare.elements = (IdxElement *)0x0;
  (this->super_SPxPricer<double>)._vptr_SPxPricer = (_func_int **)&PTR_getName_003354f0;
  Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::Array(&this->pricSet,&old->pricSet);
  iVar2 = old->used;
  iVar3 = old->min;
  iVar4 = old->last;
  this->multiParts = old->multiParts;
  this->used = iVar2;
  this->min = iVar3;
  this->last = iVar4;
  this->partialSize = old->partialSize;
  return;
}

Assistant:

SPxParMultPR(const SPxParMultPR& old)
      : SPxPricer<R>(old)
      , pricSet(old.pricSet)
      , multiParts(old.multiParts)
      , used(old.used)
      , min(old.min)
      , last(old.last)
      , partialSize(old.partialSize)
   {}